

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O1

void __thiscall
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
optimize<bvh::v2::ParallelExecutor>
          (ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,
          Executor<bvh::v2::ParallelExecutor> *executor,Config *config)

{
  pointer pNVar1;
  Index IVar2;
  Index IVar3;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *pBVar4;
  undefined8 uVar5;
  int *piVar6;
  pointer puVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  sbyte sVar16;
  undefined8 uVar17;
  Candidate CVar18;
  unkbyte9 Var19;
  Reinsertion *pRVar20;
  pointer pRVar21;
  pointer pRVar22;
  Executor<bvh::v2::ParallelExecutor> *pEVar23;
  _Bit_type *p_Var24;
  uint uVar25;
  pointer pNVar26;
  long *plVar27;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
  _Var28;
  unsigned_long *puVar29;
  unsigned_long uVar30;
  long lVar31;
  ulong uVar32;
  size_t sVar33;
  long lVar34;
  size_t i;
  ulong uVar35;
  _Bit_type *p_Var36;
  Reinsertion *pRVar37;
  undefined8 *puVar38;
  unsigned_long uVar39;
  pointer pNVar40;
  ulong uVar41;
  byte bVar42;
  ulong uVar43;
  undefined1 in_ZMM0 [64];
  float fVar44;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  candidates;
  _Iter_comp_iter<std::greater<void>_> __cmp;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  reinsertions;
  vector<bool,_std::allocator<bool>_> touched;
  undefined1 local_108 [16];
  Candidate *local_f8;
  _Any_data local_e8;
  code *pcStack_d8;
  code *pcStack_d0;
  unsigned_long local_c8;
  unsigned_long local_c0;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  local_b8;
  long local_a0;
  Executor<bvh::v2::ParallelExecutor> *local_98;
  vector<bool,_std::allocator<bool>_> local_90;
  unique_lock<std::mutex> local_68;
  undefined8 local_58;
  ulong local_50;
  ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_48;
  Config *local_40;
  ulong local_38;
  
  pBVar4 = this->bvh_;
  auVar15 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                               ((long)(pBVar4->nodes).
                                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pBVar4->nodes).
                                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                               0x6db6db6db6db6db7);
  lVar31 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar15._0_4_ * config->batch_size_ratio)));
  local_50 = lVar31 + (ulong)(lVar31 == 0);
  local_b8.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_start = (Reinsertion *)0x0;
  local_b8.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Reinsertion *)0x0;
  local_b8.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_pod_data[0] = '\0';
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,
             ((long)(pBVar4->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pBVar4->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7,
             (bool *)local_e8._M_pod_data,(allocator_type *)&local_68);
  if (config->max_iter_count != 0) {
    local_50 = local_50 + 1;
    uVar43 = 0;
    local_98 = executor;
    local_48 = this;
    local_40 = config;
    do {
      uVar35 = ((long)(this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
      if (local_50 < uVar35) {
        uVar35 = local_50;
      }
      local_108 = ZEXT816(0) << 0x40;
      local_f8 = (Candidate *)0x0;
      local_38 = uVar43;
      if (1 < uVar35) {
        uVar43 = 1;
        lVar31 = 0x30;
        do {
          local_e8._M_pod_data[0] = (char)uVar43;
          local_e8._1_7_ = (undefined7)(uVar43 >> 8);
          pNVar26 = (this->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          fVar44 = *(float *)((long)&pNVar26->bounds + lVar31 + -0x10) -
                   *(float *)((long)&pNVar26->bounds + lVar31 + -0x14);
          fVar14 = *(float *)((long)&pNVar26->bounds + lVar31 + -8) -
                   *(float *)((long)&pNVar26->bounds + lVar31 + -0xc);
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar14)),
                                    ZEXT416((uint)(*(float *)((long)&pNVar26->bounds + lVar31) -
                                                  *(float *)((long)&pNVar26->bounds + lVar31 + -4)))
                                    ,ZEXT416((uint)(fVar44 + fVar14)));
          local_e8._8_4_ = auVar15._0_4_;
          if ((Candidate *)local_108._8_8_ == local_f8) {
            std::
            vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>
            ::
            _M_realloc_insert<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>
                      ((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>
                        *)local_108,(iterator)local_108._8_8_,(Candidate *)&local_e8);
          }
          else {
            CVar18.cost = (Scalar)local_e8._8_4_;
            CVar18.node_id = uVar43;
            CVar18._12_4_ = local_e8._12_4_;
            *(Candidate *)local_108._8_8_ = CVar18;
            local_108._8_8_ = (Candidate *)(local_108._8_8_ + 0x10);
          }
          uVar43 = uVar43 + 1;
          lVar31 = lVar31 + 0x1c;
        } while (uVar35 != uVar43);
      }
      std::
      __make_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                ((__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>_>
                  )local_108._0_8_,
                 (__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>_>
                  )local_108._8_8_,(_Iter_comp_iter<std::greater<void>_> *)local_e8._M_pod_data);
      pEVar23 = local_98;
      pNVar26 = (this->bvh_->nodes).
                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar35 < (ulong)(((long)(this->bvh_->nodes).
                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar26 >> 2) *
                          0x6db6db6db6db6db7)) {
        do {
          fVar44 = *(float *)((long)(pNVar26 + uVar35) + 4) - pNVar26[uVar35].bounds._M_elems[0];
          fVar14 = *(float *)((long)(pNVar26 + uVar35) + 0xc) -
                   *(float *)((long)(pNVar26 + uVar35) + 8);
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar14)),
                                    ZEXT416((uint)(*(float *)((long)(pNVar26 + uVar35) + 0x14) -
                                                  *(float *)((long)(pNVar26 + uVar35) + 0x10))),
                                    ZEXT416((uint)(fVar44 + fVar14)));
          fVar44 = auVar15._0_4_;
          if (*(float *)(local_108._0_8_ + 8) < fVar44) {
            if (0x10 < (long)(local_108._8_8_ - local_108._0_8_)) {
              uVar5 = *(undefined8 *)(local_108._8_8_ + -0x10);
              *(undefined8 *)(local_108._8_8_ + -0x10) = *(undefined8 *)local_108._0_8_;
              *(undefined4 *)(local_108._8_8_ + -8) = *(undefined4 *)(local_108._0_8_ + 8);
              local_a0 = CONCAT44(local_a0._4_4_,fVar44);
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,long,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                        (local_108._0_8_,0,(local_108._8_8_ + -0x10) - local_108._0_8_ >> 4,uVar5);
              fVar44 = (float)local_a0;
            }
            *(ulong *)(local_108._8_8_ + -0x10) = uVar35;
            *(float *)(local_108._8_8_ + -8) = fVar44;
            lVar34 = (long)(local_108._8_8_ - local_108._0_8_) >> 4;
            lVar31 = lVar34 + -1;
            if (1 < lVar34) {
              do {
                lVar34 = (lVar31 + -1) - (lVar31 + -1 >> 0x3f) >> 1;
                if (*(float *)(local_108._0_8_ + 8 + lVar34 * 0x10) <= fVar44) break;
                puVar38 = (undefined8 *)(lVar34 * 0x10 + local_108._0_8_);
                *(undefined4 *)(local_108._0_8_ + 8 + lVar31 * 0x10) = *(undefined4 *)(puVar38 + 1);
                *(undefined8 *)(local_108._0_8_ + lVar31 * 0x10) = *puVar38;
                bVar8 = 2 < lVar31;
                lVar31 = lVar34;
              } while (bVar8);
            }
            *(ulong *)(local_108._0_8_ + lVar31 * 0x10) = uVar35;
            *(float *)(local_108._0_8_ + 8 + lVar31 * 0x10) = fVar44;
          }
          uVar35 = uVar35 + 1;
          pNVar26 = (this->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar35 < (ulong)(((long)(this->bvh_->nodes).
                                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar26
                                  >> 2) * 0x6db6db6db6db6db7));
      }
      uVar25 = local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset;
      p_Var24 = local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p;
      p_Var36 = local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p) {
        memset(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p,0,
               (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        p_Var36 = p_Var24;
      }
      if (uVar25 != 0) {
        bVar42 = (byte)uVar25;
        sVar16 = (bVar42 < 0x41) * ('@' - bVar42);
        *p_Var36 = *p_Var36 & ~((ulong)(-1L << sVar16) >> sVar16);
      }
      std::
      vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
      ::resize(&local_b8,(long)(local_108._8_8_ - local_108._0_8_) >> 4);
      uVar43 = (long)(local_108._8_8_ - local_108._0_8_) >> 4;
      if (uVar43 < *(ulong *)(pEVar23 + 8)) {
        if (local_108._8_8_ != local_108._0_8_) {
          lVar34 = 0;
          lVar31 = 0;
          do {
            find_reinsertion((Reinsertion *)&local_e8,this,*(size_t *)(local_108._0_8_ + lVar34));
            *(undefined4 *)
             ((long)&(local_b8.
                      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                      ._M_impl.super__Vector_impl_data._M_start)->area_diff + lVar31) =
                 pcStack_d8._0_4_;
            auVar15._1_7_ = local_e8._1_7_;
            auVar15[0] = local_e8._M_pod_data[0];
            auVar15._8_4_ = local_e8._8_4_;
            auVar15._12_4_ = local_e8._12_4_;
            *(undefined1 (*) [16])
             ((long)&(local_b8.
                      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                      ._M_impl.super__Vector_impl_data._M_start)->from + lVar31) = auVar15;
            lVar31 = lVar31 + 0x18;
            lVar34 = lVar34 + 0x10;
            uVar43 = uVar43 - 1;
          } while (uVar43 != 0);
        }
      }
      else {
        lVar31 = *(long *)pEVar23;
        uVar35 = uVar43 / (ulong)(*(long *)(lVar31 + 0x38) - *(long *)(lVar31 + 0x30) >> 3);
        local_a0 = uVar35 + (uVar35 == 0);
        if (local_108._8_8_ != local_108._0_8_) {
          uVar35 = 0;
          do {
            lVar31 = *(long *)local_98;
            local_e8._M_pod_data[0] = '\0';
            local_e8._1_7_ = 0;
            local_e8._8_4_ = 0;
            local_e8._12_4_ = 0;
            pcStack_d8 = (code *)0x0;
            pcStack_d0 = (code *)0x0;
            plVar27 = (long *)operator_new(0x28);
            uVar41 = uVar35 + local_a0;
            uVar32 = uVar43;
            if (uVar41 < uVar43) {
              uVar32 = uVar41;
            }
            *plVar27 = (long)&local_b8;
            plVar27[1] = (long)this;
            plVar27[2] = (long)local_108;
            plVar27[3] = uVar35;
            plVar27[4] = uVar32;
            local_e8._M_pod_data[0] = (char)plVar27;
            local_e8._1_7_ = (undefined7)((ulong)plVar27 >> 8);
            pcStack_d0 = std::
                         _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                         ::_M_invoke;
            pcStack_d8 = std::
                         _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                         ::_M_manager;
            local_68._M_device = (mutex_type *)(lVar31 + 8);
            local_68._M_owns = false;
            std::unique_lock<std::mutex>::lock(&local_68);
            local_68._M_owns = true;
            std::
            deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
            ::emplace_back<std::function<void(unsigned_long)>>
                      ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                        *)(lVar31 + 0xa8),(function<void_(unsigned_long)> *)&local_e8);
            std::unique_lock<std::mutex>::~unique_lock(&local_68);
            std::condition_variable::notify_one();
            if (pcStack_d8 != (code *)0x0) {
              (*pcStack_d8)(&local_e8,&local_e8,__destroy_functor);
            }
            uVar35 = uVar41;
            this = local_48;
          } while (uVar41 < uVar43);
        }
        piVar6 = *(int **)local_98;
        local_e8._M_pod_data[0] = (char)(piVar6 + 2);
        local_e8._1_7_ = (undefined7)((ulong)(piVar6 + 2) >> 8);
        local_e8._8_4_ = local_e8._8_4_ & 0xffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_e8);
        local_e8._M_pod_data[8] = 1;
        while ((*piVar6 != 0 || (*(long *)(piVar6 + 0x36) != *(long *)(piVar6 + 0x2e)))) {
          std::condition_variable::wait((unique_lock *)(piVar6 + 0x1e));
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_e8);
      }
      _Var28 = std::
               __remove_if<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,__gnu_cxx::__ops::_Iter_pred<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(auto:1&)_1_>>
                         (local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      pRVar21 = local_b8.
                super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((_Var28._M_current !=
           local_b8.
           super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (local_b8.
          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          ._M_impl.super__Vector_impl_data._M_finish != _Var28._M_current)) {
        local_b8.
        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var28;
      }
      pRVar22 = local_b8.
                super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pRVar37 = local_b8.
                super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar20 = local_b8.
                super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b8.
          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                  (local_b8.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_b8.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (int)LZCOUNT(((long)local_b8.
                                       super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                  (pRVar21,pRVar22);
        pRVar37 = local_b8.
                  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar20 = local_b8.
                  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; uVar43 = local_38, pRVar37 != pRVar20; pRVar37 = pRVar37 + 1) {
        uVar43 = pRVar37->from;
        sVar33 = pRVar37->to;
        local_e8._M_pod_data[0] = (char)sVar33;
        local_e8._1_7_ = (undefined7)(sVar33 >> 8);
        local_e8._8_4_ = (undefined4)uVar43;
        local_e8._12_4_ = (undefined4)(uVar43 >> 0x20);
        pcStack_d8 = (code *)((-(ulong)((uVar43 & 1) == 0) | 1) + uVar43);
        puVar7 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcStack_d0 = (code *)puVar7[sVar33];
        local_c8 = puVar7[uVar43];
        puVar29 = std::
                  __find_if<unsigned_long*,__gnu_cxx::__ops::_Iter_pred<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long)_1_>>
                            (&local_e8,&local_c0,&local_90);
        if (puVar29 == &local_c0) {
          lVar31 = 0;
          do {
            uVar43 = *(ulong *)((long)&local_e8 + lVar31);
            uVar35 = uVar43 + 0x3f;
            if (-1 < (long)uVar43) {
              uVar35 = uVar43;
            }
            local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar35 >> 6) + ((ulong)((uVar43 & 0x800000000000003f) < 0x8000000000000001) - 1)
            ] = local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p
                [((long)uVar35 >> 6) +
                 ((ulong)((uVar43 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                1L << (uVar43 & 0x3f);
            lVar31 = lVar31 + 8;
          } while (lVar31 != 0x28);
          uVar43 = pRVar37->from;
          sVar33 = pRVar37->to;
          uVar35 = (ulong)((uVar43 & 1) == 0);
          uVar41 = uVar43 - uVar35;
          uVar39 = (-uVar35 | 1) + uVar43;
          uVar30 = (this->parents_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar43];
          pNVar40 = (this->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_58 = *(undefined8 *)((long)(pNVar40 + uVar39) + 0x10);
          pNVar26 = pNVar40 + uVar39;
          local_68._M_device = *(mutex_type **)&pNVar26->bounds;
          lVar31 = *(long *)((long)&pNVar26->bounds + 8);
          Var19 = *(unkbyte9 *)&pNVar26->bounds;
          local_68._M_owns = SUB81(lVar31,0);
          local_68._9_7_ = SUB87((ulong)lVar31 >> 8,0);
          if (0xfffffff < uVar41) {
            __assert_fail("first_id <= static_cast<size_t>(max_first_id)",
                          "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                          ,0x4f,
                          "bvh::v2::Index<32, 4>::Index(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                         );
          }
          pNVar26 = pNVar40 + uVar39;
          IVar2.value = ((Index *)((long)(pNVar40 + uVar39) + 0x18))->value;
          pNVar1 = pNVar40 + sVar33;
          IVar3.value = ((Index *)((long)(pNVar40 + sVar33) + 0x18))->value;
          (pNVar1->index).value = (int)uVar41 << 4;
          uVar5 = *(undefined8 *)&pNVar1->bounds;
          uVar17 = *(undefined8 *)((long)&pNVar1->bounds + 8);
          *(undefined8 *)((long)&pNVar26->bounds + 0x10) =
               *(undefined8 *)((long)&pNVar1->bounds + 0x10);
          *(undefined8 *)&pNVar26->bounds = uVar5;
          *(undefined8 *)((long)&pNVar26->bounds + 8) = uVar17;
          (pNVar26->index).value = IVar3.value;
          pNVar26 = (local_48->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)(pNVar26 + uVar30) + 0x10) = local_58;
          auVar9._9_7_ = local_68._9_7_;
          auVar9._0_9_ = Var19;
          *(undefined1 (*) [16])&pNVar26[uVar30].bounds = auVar9;
          ((Index *)((long)(pNVar26 + uVar30) + 0x18))->value = IVar2.value;
          if ((IVar3.value & 0xf) == 0) {
            puVar7 = (local_48->parents_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar7[IVar3.value >> 4] = uVar39;
            puVar7[(ulong)(IVar3.value >> 4) + 1] = uVar39;
          }
          if ((IVar2.value & 0xf) == 0) {
            puVar7 = (local_48->parents_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar7[IVar2.value >> 4] = uVar30;
            puVar7[(ulong)(IVar2.value >> 4) + 1] = uVar30;
          }
          puVar7 = (local_48->parents_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7[uVar39] = sVar33;
          puVar7[uVar43] = sVar33;
          pNVar26 = (local_48->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            IVar2.value = ((Index *)((long)(pNVar26 + sVar33) + 0x18))->value;
            if ((IVar2.value & 0xf) == 0) {
              pNVar40 = pNVar26 + sVar33;
              uVar43 = (ulong)(IVar2.value >> 4);
              auVar11 = vminss_avx(ZEXT416(*(uint *)&pNVar26[uVar43].bounds),
                                   ZEXT416(*(uint *)&pNVar26[uVar43 + 1].bounds));
              auVar12 = vminss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 8)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 8)));
              auVar13 = vminss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 0x10)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 0x10)));
              auVar15 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 4)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 4)));
              auVar9 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 0xc)),
                                  ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 0xc)));
              auVar10 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 0x14)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 0x14)));
              *(int *)&pNVar40->bounds = auVar11._0_4_;
              *(float *)((long)&pNVar40->bounds + 4) = auVar15._0_4_;
              *(float *)((long)&pNVar40->bounds + 8) = auVar12._0_4_;
              *(float *)((long)&pNVar40->bounds + 0xc) = auVar9._0_4_;
              *(float *)((long)&pNVar40->bounds + 0x10) = auVar13._0_4_;
              *(float *)((long)&pNVar40->bounds + 0x14) = auVar10._0_4_;
            }
            sVar33 = puVar7[sVar33];
          } while (sVar33 != 0);
          do {
            IVar2.value = ((Index *)((long)(pNVar26 + uVar30) + 0x18))->value;
            if ((IVar2.value & 0xf) == 0) {
              pNVar40 = pNVar26 + uVar30;
              uVar43 = (ulong)(IVar2.value >> 4);
              auVar11 = vminss_avx(ZEXT416(*(uint *)&pNVar26[uVar43].bounds),
                                   ZEXT416(*(uint *)&pNVar26[uVar43 + 1].bounds));
              auVar12 = vminss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 8)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 8)));
              auVar13 = vminss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 0x10)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 0x10)));
              auVar15 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 4)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 4)));
              auVar9 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 0xc)),
                                  ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 0xc)));
              auVar10 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43) + 0x14)),
                                   ZEXT416((uint)*(float *)((long)(pNVar26 + uVar43 + 1) + 0x14)));
              *(int *)&pNVar40->bounds = auVar11._0_4_;
              *(float *)((long)&pNVar40->bounds + 4) = auVar15._0_4_;
              *(float *)((long)&pNVar40->bounds + 8) = auVar12._0_4_;
              *(float *)((long)&pNVar40->bounds + 0xc) = auVar9._0_4_;
              *(float *)((long)&pNVar40->bounds + 0x10) = auVar13._0_4_;
              *(float *)((long)&pNVar40->bounds + 0x14) = auVar10._0_4_;
            }
            uVar30 = puVar7[uVar30];
            this = local_48;
          } while (uVar30 != 0);
        }
      }
      if ((void *)local_108._0_8_ != (void *)0x0) {
        operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
      }
      uVar43 = uVar43 + 1;
    } while (uVar43 < local_40->max_iter_count);
  }
  if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_b8.
      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
      ._M_impl.super__Vector_impl_data._M_start != (Reinsertion *)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void optimize(Executor<Derived>& executor, const Config& config) {
        auto batch_size = std::max(size_t{1},
            static_cast<size_t>(static_cast<Scalar>(bvh_.nodes.size()) * config.batch_size_ratio));
        std::vector<Reinsertion> reinsertions;
        std::vector<bool> touched(bvh_.nodes.size());

        for (size_t iter = 0; iter < config.max_iter_count; ++iter) {
            auto candidates = find_candidates(batch_size);

            std::fill(touched.begin(), touched.end(), false);
            reinsertions.resize(candidates.size());
            executor.for_each(0, candidates.size(),
                [&] (size_t begin, size_t end) {
                    for (size_t i = begin; i < end; ++i)
                        reinsertions[i] = find_reinsertion(candidates[i].node_id);
                });

            reinsertions.erase(std::remove_if(reinsertions.begin(), reinsertions.end(),
                [] (auto& r) { return r.area_diff <= 0; }), reinsertions.end());
            std::sort(reinsertions.begin(), reinsertions.end(), std::greater<>{});

            for (auto& reinsertion : reinsertions) {
                auto conflicts = get_conflicts(reinsertion.from, reinsertion.to);
                if (std::any_of(conflicts.begin(), conflicts.end(), [&] (size_t i) { return touched[i]; }))
                    continue;
                for (auto conflict : conflicts)
                    touched[conflict] = true;
                reinsert_node(reinsertion.from, reinsertion.to);
            }
        }
    }